

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

h264_macroblock * h264_inter_filter(h264_slice *slice,h264_macroblock *mb,int inter)

{
  int iVar1;
  int in_EDX;
  h264_macroblock *in_RSI;
  long in_RDI;
  h264_macroblock *local_8;
  
  local_8 = in_RSI;
  if ((((in_EDX == 0) && (*(int *)(*(long *)(in_RDI + 0x38) + 0xb0) != 0)) &&
      (*(int *)(in_RDI + 4) == 2)) && (iVar1 = h264_is_inter_mb_type(in_RSI->mb_type), iVar1 != 0))
  {
    local_8 = h264_mb_unavail(1);
  }
  return local_8;
}

Assistant:

const struct h264_macroblock *h264_inter_filter(struct h264_slice *slice, const struct h264_macroblock *mb, int inter) {
	if (!inter
			&& slice->picparm->constrained_intra_pred_flag
			&& slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_PART_A
			&& h264_is_inter_mb_type(mb->mb_type))
		return h264_mb_unavail(1);
	else
		return mb;
}